

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

bool __thiscall Js::BigUInt::FInitFromRglu(BigUInt *this,uint32 *prglu,int32 clu)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  AssertValid(this,true);
  if (clu < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x55,"(clu >= 0)","clu >= 0");
    if (!bVar2) goto LAB_0069721b;
    *puVar3 = 0;
  }
  if (prglu == (uint32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x56,"(prglu != 0)","prglu != 0");
    if (!bVar2) {
LAB_0069721b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->m_cluMax < clu) && (bVar2 = FResize(this,clu), !bVar2)) {
    return false;
  }
  this->m_clu = clu;
  if (0 < clu) {
    js_memcpy_s(this->m_prglu,(ulong)(uint)clu << 2,prglu,(ulong)(uint)clu << 2);
  }
  AssertValid(this,true);
  return true;
}

Assistant:

bool BigUInt::FInitFromRglu(uint32 *prglu, int32 clu)
    {
        AssertBi(this);
        Assert(clu >= 0);
        Assert(prglu != 0);

        if (clu > m_cluMax && !FResize(clu))
            return false;
        m_clu = clu;
        if (clu > 0)
            js_memcpy_s(m_prglu, m_clu * sizeof(uint32), prglu, clu * sizeof(uint32));

        AssertBi(this);
        return true;
    }